

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O0

void __thiscall
SQCompilation::CheckerVisitor::applyAssignEqToScope(CheckerVisitor *this,BinExpr *bin)

{
  SQChar *pSVar1;
  ValueRef *this_00;
  BinExpr *in_RSI;
  long in_RDI;
  ValueRef *v;
  SQChar *name;
  SQChar buffer [128];
  Expr *lhs;
  size_t in_stack_ffffffffffffff60;
  SQChar *in_stack_ffffffffffffff68;
  Expr *in_stack_ffffffffffffff70;
  CheckerVisitor *in_stack_ffffffffffffff78;
  FunctionDecl *in_stack_ffffffffffffff80;
  SQChar *in_stack_ffffffffffffff88;
  FunctionInfo *in_stack_ffffffffffffff90;
  
  BinExpr::lhs(in_RSI);
  memset(&stack0xffffffffffffff68,0,0x80);
  pSVar1 = computeNameRef(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                          in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  if ((pSVar1 != (SQChar *)0x0) &&
     (this_00 = findValueInScopes(in_stack_ffffffffffffff78,(SQChar *)in_stack_ffffffffffffff70),
     this_00 != (ValueRef *)0x0)) {
    if (*(long *)(in_RDI + 0x150) != 0) {
      FunctionInfo::addModifiable
                (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    }
    ValueRef::kill(this_00,4,1);
    this_00->evalIndex = **(int32_t **)(in_RDI + 0x40);
  }
  return;
}

Assistant:

void CheckerVisitor::applyAssignEqToScope(const BinExpr *bin) {
  assert(TO_PLUSEQ <= bin->op() && bin->op() <= TO_MODEQ);

  const Expr *lhs = bin->lhs();

  SQChar buffer[128] = { 0 };
  const SQChar *name = computeNameRef(lhs, buffer, sizeof buffer);
  if (!name)
    return;

  ValueRef *v = findValueInScopes(name);

  if (v) {
    if (currentInfo) {
      currentInfo->addModifiable(name, v->info->ownedScope->owner);
    }
    v->kill();
    v->evalIndex = currentScope->evalId;
  }
}